

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall
helics::apps::Connector::scanPotentialInterfaces
          (Connector *this,ConnectionsList *possibleConnections)

{
  bool bVar1;
  _Hash_node_base *p_Var2;
  
  p_Var2 = (possibleConnections->potentialInputs)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      bVar1 = checkPotentialConnection
                        (this,*(string_view *)(p_Var2 + 1),&possibleConnections->tagCodes,
                         &possibleConnections->pubs,&possibleConnections->potentialPubs,
                         &possibleConnections->potentialPublicationTemplates,
                         &possibleConnections->aliases);
      if (bVar1) {
        *(undefined1 *)&p_Var2[7]._M_nxt = 1;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  p_Var2 = (possibleConnections->potentialPubs)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      if (*(char *)&p_Var2[7]._M_nxt == '\0') {
        bVar1 = checkPotentialConnection
                          (this,*(string_view *)(p_Var2 + 1),&possibleConnections->tagCodes,
                           &possibleConnections->inputs,&possibleConnections->potentialInputs,
                           &possibleConnections->potentialInputTemplates,
                           &possibleConnections->aliases);
        if (bVar1) {
          *(undefined1 *)&p_Var2[7]._M_nxt = 1;
        }
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  p_Var2 = (possibleConnections->potentialEndpoints)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      if (*(char *)&p_Var2[7]._M_nxt == '\0') {
        bVar1 = checkPotentialConnection
                          (this,*(string_view *)(p_Var2 + 1),&possibleConnections->tagCodes,
                           &possibleConnections->endpoints,&possibleConnections->potentialEndpoints,
                           &possibleConnections->potentialEndpointTemplates,
                           &possibleConnections->aliases);
        if (bVar1) {
          *(undefined1 *)&p_Var2[7]._M_nxt = 1;
        }
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Connector::scanPotentialInterfaces(ConnectionsList& possibleConnections)
{
    /** potential inputs*/
    for (auto& pInp : possibleConnections.potentialInputs) {
        if (checkPotentialConnection(pInp.first,
                                     possibleConnections.tagCodes,
                                     possibleConnections.pubs,
                                     possibleConnections.potentialPubs,
                                     possibleConnections.potentialPublicationTemplates,
                                     possibleConnections.aliases)) {
            pInp.second.used = true;
        }
    }
    /* potential publications*/
    for (auto& pPub : possibleConnections.potentialPubs) {
        if (pPub.second.used) {
            continue;
        }
        if (checkPotentialConnection(pPub.first,
                                     possibleConnections.tagCodes,
                                     possibleConnections.inputs,
                                     possibleConnections.potentialInputs,
                                     possibleConnections.potentialInputTemplates,
                                     possibleConnections.aliases)) {
            pPub.second.used = true;
        }
    }

    /* potential endpoints*/
    for (auto& pEnd : possibleConnections.potentialEndpoints) {
        if (pEnd.second.used) {
            continue;
        }
        if (checkPotentialConnection(pEnd.first,
                                     possibleConnections.tagCodes,
                                     possibleConnections.endpoints,
                                     possibleConnections.potentialEndpoints,
                                     possibleConnections.potentialEndpointTemplates,
                                     possibleConnections.aliases)) {
            pEnd.second.used = true;
        }
    }
}